

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O1

void __thiscall QStyleOptionMenuItem::~QStyleOptionMenuItem(QStyleOptionMenuItem *this)

{
  Data *pDVar1;
  
  QFont::~QFont(&this->font);
  QIcon::~QIcon(&this->icon);
  pDVar1 = (this->text).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->text).d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption(&this->super_QStyleOption);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QStyleOptionMenuItem : public QStyleOption
{
public:
    enum StyleOptionType { Type = SO_MenuItem };
    enum StyleOptionVersion { Version = 1 };

    enum MenuItemType { Normal, DefaultItem, Separator, SubMenu, Scroller, TearOff, Margin,
                        EmptyArea };
    enum CheckType { NotCheckable, Exclusive, NonExclusive };

    MenuItemType menuItemType;
    CheckType checkType;
    bool checked;
    bool menuHasCheckableItems;
    QRect menuRect;
    QString text;
    QIcon icon;
    int maxIconWidth;
    int reservedShortcutWidth;
    QFont font;

    QStyleOptionMenuItem();
    QStyleOptionMenuItem(const QStyleOptionMenuItem &other) : QStyleOption(Version, Type) { *this = other; }
    QStyleOptionMenuItem &operator=(const QStyleOptionMenuItem &) = default;

protected:
    QStyleOptionMenuItem(int version);
}